

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall
cmComputeLinkDepends::AddLinkEntries<cmLinkImplItem>
          (cmComputeLinkDepends *this,int depender_index,
          vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *libs)

{
  map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  *pmVar1;
  cmake *pcVar2;
  string_view prefix;
  string_view prefix_00;
  bool bVar3;
  __type _Var4;
  bool bVar5;
  TargetType TVar6;
  string *psVar7;
  string *__rhs;
  ulong uVar8;
  reference pvVar9;
  pair<int,_bool> pVar10;
  reference pvVar11;
  reference __x;
  reference piVar12;
  reference piVar13;
  vector<cmGraphEdge,std::allocator<cmGraphEdge>> *pvVar14;
  reference ppVar15;
  reference pvVar16;
  string_view sVar17;
  string_view sVar18;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_bool>
  pVar19;
  pair<const_int,_cmComputeLinkDepends::DependSet> *dependSet_1;
  iterator __end1;
  iterator __begin1;
  map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  *__range1_1;
  pair<const_int,_cmComputeLinkDepends::DependSet> *dependSet;
  iterator __end4_2;
  iterator __begin4_2;
  map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  *__range4_2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_7f0;
  bool local_7e6;
  bool local_7e5;
  int local_7e4;
  iterator iStack_7e0;
  int index_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<int,_std::allocator<int>_> *__range3_1;
  const_iterator cStack_7c0;
  int index;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<int,_std::allocator<int>_> *__range4_1;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> *group;
  iterator __end3;
  iterator __begin3;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *__range3;
  undefined1 local_780 [7];
  bool entryHandled;
  vector<int,_std::allocator<int>_> indexes;
  char local_751;
  cmAlphaNum local_750;
  cmAlphaNum local_720;
  byte local_6ea;
  allocator<char> local_6e9;
  string local_6e8;
  char local_6c1;
  cmAlphaNum local_6c0;
  cmAlphaNum local_690;
  byte local_65a;
  allocator<char> local_659;
  string local_658;
  cmAlphaNum local_638;
  cmAlphaNum local_608;
  string local_5d8;
  undefined1 local_5b8 [72];
  cmAlphaNum local_570;
  string local_540;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_520;
  int *local_518;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_510;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_508;
  _Base_ptr local_500;
  string *groupFeature_2;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> *g;
  iterator __end4;
  iterator __begin4;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *__range4;
  string *currentFeature;
  undefined1 local_4c8 [7];
  bool supportedItem;
  cmLocalGenerator *local_4b8;
  cmAlphaNum local_4b0;
  cmAlphaNum local_480;
  string local_450;
  undefined1 local_430 [72];
  cmAlphaNum local_3e8;
  string local_3b8;
  string *local_398;
  string *groupFeature_1;
  string *itemFeature;
  LinkEntry *entry;
  pair<int,_bool> ale;
  cmAlphaNum local_368;
  cmAlphaNum local_338;
  string local_308;
  undefined8 local_2e8;
  string *groupFeature;
  value_type *depender_1;
  pair<int,_bool> local_2d0;
  __node_base local_2c8;
  undefined1 local_2c0;
  string_view local_2b8;
  _Base_ptr local_2a8;
  _Base_ptr p_Stack_2a0;
  string_view local_290;
  float local_27c;
  undefined1 auStack_278 [4];
  int dependee_index;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_270;
  bool local_25a;
  bool local_259;
  string local_258;
  reference local_238;
  LinkEntry *entry_1;
  string_view local_228;
  _Base_ptr local_218;
  __node_base _Stack_210;
  string_view local_208;
  string_view local_1f8;
  _Base_ptr local_1e8;
  _Base_ptr p_Stack_1e0;
  string_view local_1d0;
  undefined1 local_1c0 [64];
  cmAlphaNum local_180;
  string local_150;
  undefined8 local_130;
  value_type *depender;
  string_view local_108;
  _Base_ptr local_f8;
  _Base_ptr p_Stack_f0;
  string_view local_e0;
  reference local_d0;
  cmLinkItem *item;
  cmLinkImplItem *l;
  const_iterator __end0;
  const_iterator __begin0;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range1;
  vector<int,_std::allocator<int>_> groupItems;
  pair<int,_bool> local_88;
  pair<int,_bool> groupIndex;
  bool inGroup;
  undefined1 local_70 [8];
  string feature;
  map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  dependSets;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *libs_local;
  int depender_index_local;
  cmComputeLinkDepends *this_local;
  
  std::
  map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  ::map((map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
         *)((long)&feature.field_2 + 8));
  std::__cxx11::string::string((string *)local_70,(string *)&LinkEntry::DEFAULT_abi_cxx11_);
  groupIndex.first._3_1_ = 0;
  groupItems.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0xffffffff;
  groupItems.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._3_1_ = 0;
  std::pair<int,_bool>::pair<int,_bool,_true>
            (&local_88,
             (int *)((long)&groupItems.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4),
             (bool *)((long)&groupItems.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 3));
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&__range1);
  __end0 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin(libs);
  l = (cmLinkImplItem *)std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end(libs);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                *)&l);
    if (!bVar3) {
      pmVar1 = (map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                *)((long)&feature.field_2 + 8);
      __end1 = std::
               map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
               ::begin(pmVar1);
      dependSet_1 = (pair<const_int,_cmComputeLinkDepends::DependSet> *)
                    std::
                    map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                    ::end(pmVar1);
      while( true ) {
        bVar3 = std::operator!=(&__end1,(_Self *)&dependSet_1);
        if (!bVar3) break;
        ppVar15 = std::_Rb_tree_iterator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>::
                  operator*(&__end1);
        pvVar16 = std::
                  vector<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
                  ::operator[](&this->InferredDependSets,(long)ppVar15->first);
        std::
        vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>::
        push_back(&pvVar16->
                   super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                  ,&ppVar15->second);
        std::_Rb_tree_iterator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>::operator++
                  (&__end1);
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)&__range1);
      std::__cxx11::string::~string((string *)local_70);
      std::
      map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
      ::~map((map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
              *)((long)&feature.field_2 + 8));
      return;
    }
    local_d0 = __gnu_cxx::
               __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
               ::operator*(&__end0);
    item = &local_d0->super_cmLinkItem;
    psVar7 = cmLinkItem::AsStr_abi_cxx11_(&local_d0->super_cmLinkItem);
    __rhs = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    _Var4 = std::operator==(psVar7,__rhs);
    if (!_Var4) {
      cmLinkItem::AsStr_abi_cxx11_(&local_d0->super_cmLinkItem);
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        psVar7 = cmLinkItem::AsStr_abi_cxx11_(&local_d0->super_cmLinkItem);
        sVar17 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
        local_f8 = (_Base_ptr)(anonymous_namespace)::LL_BEGIN._0_8_;
        p_Stack_f0 = (_Base_ptr)(anonymous_namespace)::LL_BEGIN._8_8_;
        sVar18._M_str = (char *)(anonymous_namespace)::LL_BEGIN._8_8_;
        sVar18._M_len = (anonymous_namespace)::LL_BEGIN._0_8_;
        local_e0 = sVar17;
        bVar3 = cmHasPrefix(sVar17,sVar18);
        if (bVar3) {
          psVar7 = cmLinkItem::AsStr_abi_cxx11_(&local_d0->super_cmLinkItem);
          sVar18 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
          local_108 = sVar18;
          bVar3 = cmHasSuffix(sVar18,'>');
          if (bVar3) {
            psVar7 = cmLinkItem::AsStr_abi_cxx11_(&local_d0->super_cmLinkItem);
            anon_unknown.dwarf_12883a1::ExtractFeature((string *)&depender,psVar7);
            std::__cxx11::string::operator=((string *)local_70,(string *)&depender);
            std::__cxx11::string::~string((string *)&depender);
            if (-1 < depender_index) {
              local_130 = std::
                          vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                          ::operator[](&this->EntryList,(long)depender_index);
              if (((reference)local_130)->Target != (cmGeneratorTarget *)0x0) {
                bVar3 = cmGeneratorTarget::IsImported(((reference)local_130)->Target);
                if (bVar3) {
                  bVar3 = anon_unknown.dwarf_12883a1::IsFeatureSupported
                                    (this->Makefile,&this->LinkLanguage,(string *)local_70);
                  if (!bVar3) {
                    pcVar2 = this->CMakeInstance;
                    cmAlphaNum::cmAlphaNum(&local_180,"The \'IMPORTED\' target \'");
                    psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                                       (*(cmGeneratorTarget **)(local_130 + 0x30));
                    cmAlphaNum::cmAlphaNum((cmAlphaNum *)(local_1c0 + 0x10),psVar7);
                    cmStrCat<char[69],std::__cxx11::string,char[93],std::__cxx11::string,char[21],std::__cxx11::string,char[14],std::__cxx11::string,char[21],std::__cxx11::string,char[13]>
                              (&local_150,&local_180,(cmAlphaNum *)(local_1c0 + 0x10),
                               (char (*) [69])
                               "\' uses the generator-expression \'$<LINK_LIBRARY>\' with the feature \'"
                               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_70,
                               (char (*) [93])
                               "\', which is undefined or unsupported.\nDid you miss to define it by setting variables \"CMAKE_"
                               ,&this->LinkLanguage,(char (*) [21])0xddede2,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_70,(char (*) [14])"\" and \"CMAKE_",&this->LinkLanguage,
                               (char (*) [21])0xddede2,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_70,(char (*) [13])"_SUPPORTED\"?");
                    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1c0);
                    cmake::IssueMessage(pcVar2,AUTHOR_ERROR,&local_150,
                                        (cmListFileBacktrace *)local_1c0);
                    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1c0);
                    std::__cxx11::string::~string((string *)&local_150);
                  }
                }
              }
            }
            goto LAB_0089535c;
          }
        }
        psVar7 = cmLinkItem::AsStr_abi_cxx11_(&local_d0->super_cmLinkItem);
        sVar18 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
        local_1e8 = (_Base_ptr)(anonymous_namespace)::LL_END._0_8_;
        p_Stack_1e0 = (_Base_ptr)(anonymous_namespace)::LL_END._8_8_;
        sVar17._M_str = (char *)(anonymous_namespace)::LL_END._8_8_;
        sVar17._M_len = (anonymous_namespace)::LL_END._0_8_;
        local_1d0 = sVar18;
        bVar3 = cmHasPrefix(sVar18,sVar17);
        if (bVar3) {
          psVar7 = cmLinkItem::AsStr_abi_cxx11_(&local_d0->super_cmLinkItem);
          sVar18 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
          local_1f8 = sVar18;
          bVar3 = cmHasSuffix(sVar18,'>');
          if (bVar3) {
            std::__cxx11::string::operator=
                      ((string *)local_70,(string *)&LinkEntry::DEFAULT_abi_cxx11_);
            goto LAB_0089535c;
          }
        }
        psVar7 = cmLinkItem::AsStr_abi_cxx11_(&local_d0->super_cmLinkItem);
        sVar18 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
        local_218 = (anonymous_namespace)::LG_BEGIN;
        _Stack_210._M_nxt = DAT_011e2150;
        prefix_00._M_str = (char *)DAT_011e2150;
        prefix_00._M_len = (size_t)(anonymous_namespace)::LG_BEGIN;
        local_208 = sVar18;
        bVar3 = cmHasPrefix(sVar18,prefix_00);
        if (bVar3) {
          psVar7 = cmLinkItem::AsStr_abi_cxx11_(&local_d0->super_cmLinkItem);
          sVar18 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
          local_228 = sVar18;
          bVar3 = cmHasSuffix(sVar18,'>');
          if (bVar3) {
            pVar10 = AddLinkEntry(this,&local_d0->super_cmLinkItem,-1);
            entry_1._0_4_ = pVar10.first;
            entry_1._4_1_ = pVar10.second;
            std::pair<int,_bool>::operator=(&local_88,(type)&entry_1);
            if ((local_88.second & 1U) != 0) {
              local_238 = std::
                          vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                          ::operator[](&this->EntryList,(long)local_88.first);
              psVar7 = cmLinkItem::AsStr_abi_cxx11_(&local_d0->super_cmLinkItem);
              anon_unknown.dwarf_12883a1::ExtractGroupFeature(&local_258,psVar7);
              std::__cxx11::string::operator=((string *)&local_238->Feature,(string *)&local_258);
              std::__cxx11::string::~string((string *)&local_258);
            }
            groupIndex.first._3_1_ = 1;
            if (depender_index < 0) {
              std::vector<int,_std::allocator<int>_>::push_back
                        (&this->OriginalEntries,&local_88.first);
            }
            else {
              pvVar14 = (vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                        std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                                  (&(this->EntryConstraintGraph).
                                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                                   (long)depender_index);
              local_259 = false;
              local_25a = false;
              _auStack_278 = (element_type *)0x0;
              aStack_270._M_allocated_capacity = 0;
              cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)auStack_278);
              std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
              emplace_back<int&,bool,bool,cmListFileBacktrace>
                        (pvVar14,&local_88.first,&local_259,&local_25a,
                         (cmListFileBacktrace *)auStack_278);
              cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)auStack_278);
            }
            goto LAB_0089535c;
          }
        }
        psVar7 = cmLinkItem::AsStr_abi_cxx11_(&local_d0->super_cmLinkItem);
        sVar18 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
        local_2a8 = (_Base_ptr)(anonymous_namespace)::LG_END._0_8_;
        p_Stack_2a0 = (_Base_ptr)(anonymous_namespace)::LG_END._8_8_;
        prefix._M_str = (char *)(anonymous_namespace)::LG_END._8_8_;
        prefix._M_len = (anonymous_namespace)::LG_END._0_8_;
        local_290 = sVar18;
        bVar3 = cmHasPrefix(sVar18,prefix);
        if (bVar3) {
          psVar7 = cmLinkItem::AsStr_abi_cxx11_(&local_d0->super_cmLinkItem);
          sVar18 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
          local_2b8 = sVar18;
          bVar3 = cmHasSuffix(sVar18,'>');
          if (bVar3) {
            local_27c = (float)local_88.first;
            if ((local_88.second & 1U) != 0) {
              pVar19 = std::
                       map<int,std::vector<int,std::allocator<int>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                       ::emplace<int&,std::vector<int,std::allocator<int>>&>
                                 ((map<int,std::vector<int,std::allocator<int>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                                   *)&this->GroupItems,&local_88.first,
                                  (vector<int,_std::allocator<int>_> *)&__range1);
              local_2c8._M_nxt = (_Hash_node_base *)pVar19.first._M_node;
              local_2c0 = pVar19.second;
            }
            groupIndex.first._3_1_ = 0;
            depender_1._4_4_ = 0xffffffff;
            depender_1._3_1_ = 0;
            pVar10 = std::make_pair<int,bool>
                               ((int *)((long)&depender_1 + 4),(bool *)((long)&depender_1 + 3));
            local_2d0.first = pVar10.first;
            local_2d0.second = pVar10.second;
            std::pair<int,_bool>::operator=(&local_88,&local_2d0);
            std::vector<int,_std::allocator<int>_>::clear
                      ((vector<int,_std::allocator<int>_> *)&__range1);
            goto LAB_0089535c;
          }
        }
        if ((-1 < depender_index) && ((groupIndex.first._3_1_ & 1) != 0)) {
          groupFeature = (string *)
                         std::
                         vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                         ::operator[](&this->EntryList,(long)depender_index);
          pvVar9 = std::
                   vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                   ::operator[](&this->EntryList,(long)local_88.first);
          local_2e8 = &pvVar9->Feature;
          if (groupFeature[1].field_2._M_allocated_capacity != 0) {
            bVar3 = cmGeneratorTarget::IsImported
                              ((cmGeneratorTarget *)groupFeature[1].field_2._M_allocated_capacity);
            if (bVar3) {
              bVar3 = anon_unknown.dwarf_12883a1::IsGroupFeatureSupported
                                (this->Makefile,&this->LinkLanguage,(string *)local_2e8);
              if (!bVar3) {
                pcVar2 = this->CMakeInstance;
                cmAlphaNum::cmAlphaNum(&local_338,"The \'IMPORTED\' target \'");
                psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                                   ((cmGeneratorTarget *)
                                    groupFeature[1].field_2._M_allocated_capacity);
                cmAlphaNum::cmAlphaNum(&local_368,psVar7);
                cmStrCat<char[67],std::__cxx11::string,char[93],std::__cxx11::string,char[19],std::__cxx11::string,char[14],std::__cxx11::string,char[19],std::__cxx11::string,char[13]>
                          (&local_308,&local_338,&local_368,
                           (char (*) [67])
                           "\' uses the generator-expression \'$<LINK_GROUP>\' with the feature \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2e8,
                           (char (*) [93])
                           "\', which is undefined or unsupported.\nDid you miss to define it by setting variables \"CMAKE_"
                           ,&this->LinkLanguage,(char (*) [19])0xddf0ab,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2e8,(char (*) [14])"\" and \"CMAKE_",&this->LinkLanguage,
                           (char (*) [19])0xddf0ab,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2e8,(char (*) [13])"_SUPPORTED\"?");
                cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&ale);
                cmake::IssueMessage(pcVar2,AUTHOR_ERROR,&local_308,(cmListFileBacktrace *)&ale);
                cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&ale);
                std::__cxx11::string::~string((string *)&local_308);
              }
            }
          }
        }
        pVar10 = AddLinkEntry(this,&local_d0->super_cmLinkItem,local_88.first);
        entry._0_4_ = (float)pVar10.first;
        entry._4_1_ = pVar10.second;
        local_27c = entry._0_4_;
        itemFeature = (string *)
                      std::
                      vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                      ::operator[](&this->EntryList,(long)(int)entry._0_4_);
        groupFeature_1 = GetCurrentFeature(this,itemFeature,(string *)local_70);
        if ((((groupIndex.first._3_1_ & 1) != 0) && ((entry._4_1_ & 1) != 0)) &&
           (itemFeature[1].field_2._M_allocated_capacity != 0)) {
          TVar6 = cmGeneratorTarget::GetType
                            ((cmGeneratorTarget *)itemFeature[1].field_2._M_allocated_capacity);
          if (TVar6 != OBJECT_LIBRARY) {
            TVar6 = cmGeneratorTarget::GetType
                              ((cmGeneratorTarget *)itemFeature[1].field_2._M_allocated_capacity);
            if (TVar6 != INTERFACE_LIBRARY) goto LAB_008945e9;
          }
          pvVar9 = std::
                   vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                   ::operator[](&this->EntryList,(long)local_88.first);
          local_398 = &pvVar9->Feature;
          pcVar2 = this->CMakeInstance;
          cmAlphaNum::cmAlphaNum(&local_3e8,"The feature \'");
          cmAlphaNum::cmAlphaNum((cmAlphaNum *)(local_430 + 0x18),local_398);
          psVar7 = local_398;
          TVar6 = cmGeneratorTarget::GetType
                            ((cmGeneratorTarget *)itemFeature[1].field_2._M_allocated_capacity);
          local_430._16_8_ = "INTERFACE";
          if (TVar6 == OBJECT_LIBRARY) {
            local_430._16_8_ = "OBJECT";
          }
          cmStrCat<char[50],cm::static_string_view,std::__cxx11::string,char[32],char_const*,char[11],std::__cxx11::string,char[3]>
                    (&local_3b8,&local_3e8,(cmAlphaNum *)(local_430 + 0x18),
                     (char (*) [50])"\', specified as part of a generator-expression \'$",
                     (static_string_view *)&(anonymous_namespace)::LG_BEGIN,psVar7,
                     (char (*) [32])">\', will not be applied to the ",(char **)(local_430 + 0x10),
                     (char (*) [11])" library \'",itemFeature,(char (*) [3])0xdb3ea8);
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_430);
          cmake::IssueMessage(pcVar2,AUTHOR_WARNING,&local_3b8,(cmListFileBacktrace *)local_430);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_430);
          std::__cxx11::string::~string((string *)&local_3b8);
        }
LAB_008945e9:
        bVar3 = std::operator!=(groupFeature_1,&LinkEntry::DEFAULT_abi_cxx11_);
        if ((bVar3) && ((entry._4_1_ & 1) != 0)) {
          if (itemFeature[1].field_2._M_allocated_capacity == 0) {
LAB_008947cf:
            std::__cxx11::string::operator=((string *)(itemFeature + 2),(string *)groupFeature_1);
          }
          else {
            TVar6 = cmGeneratorTarget::GetType
                              ((cmGeneratorTarget *)itemFeature[1].field_2._M_allocated_capacity);
            if (TVar6 != OBJECT_LIBRARY) {
              TVar6 = cmGeneratorTarget::GetType
                                ((cmGeneratorTarget *)itemFeature[1].field_2._M_allocated_capacity);
              if (TVar6 != INTERFACE_LIBRARY) goto LAB_008947cf;
            }
            pcVar2 = this->CMakeInstance;
            cmAlphaNum::cmAlphaNum(&local_480,"The feature \'");
            cmAlphaNum::cmAlphaNum(&local_4b0,(string *)local_70);
            TVar6 = cmGeneratorTarget::GetType
                              ((cmGeneratorTarget *)itemFeature[1].field_2._M_allocated_capacity);
            local_4b8 = (cmLocalGenerator *)0xde31c5;
            if (TVar6 == OBJECT_LIBRARY) {
              local_4b8 = (cmLocalGenerator *)0xdd1ed7;
            }
            cmStrCat<char[50],cm::static_string_view,std::__cxx11::string,char[32],char_const*,char[11],std::__cxx11::string,char[3]>
                      (&local_450,&local_480,&local_4b0,
                       (char (*) [50])"\', specified as part of a generator-expression \'$",
                       (static_string_view *)(anonymous_namespace)::LL_BEGIN,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                       ,(char (*) [32])">\', will not be applied to the ",(char **)&local_4b8,
                       (char (*) [11])" library \'",itemFeature,(char (*) [3])0xdb3ea8);
            cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_4c8);
            cmake::IssueMessage(pcVar2,AUTHOR_WARNING,&local_450,(cmListFileBacktrace *)local_4c8);
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_4c8);
            std::__cxx11::string::~string((string *)&local_450);
          }
        }
        bVar3 = true;
        if (itemFeature[1].field_2._M_allocated_capacity != 0) {
          TVar6 = cmGeneratorTarget::GetType
                            ((cmGeneratorTarget *)itemFeature[1].field_2._M_allocated_capacity);
          bVar3 = false;
          if (TVar6 != OBJECT_LIBRARY) {
            TVar6 = cmGeneratorTarget::GetType
                              ((cmGeneratorTarget *)itemFeature[1].field_2._M_allocated_capacity);
            bVar3 = TVar6 != INTERFACE_LIBRARY;
          }
        }
        if (bVar3) {
          if ((groupIndex.first._3_1_ & 1) != 0) {
            pvVar9 = std::
                     vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                     ::operator[](&this->EntryList,(long)local_88.first);
            __end4 = std::
                     map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ::begin(&this->GroupItems);
            g = (pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)
                std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::end(&this->GroupItems);
            while( true ) {
              bVar3 = std::operator!=(&__end4,(_Self *)&g);
              if (!bVar3) break;
              groupFeature_2 =
                   (string *)
                   std::
                   _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                   ::operator*(&__end4);
              pvVar11 = std::
                        vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                        ::operator[](&this->EntryList,(long)*(int *)groupFeature_2);
              local_500 = (_Base_ptr)&pvVar11->Feature;
              _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_500,&pvVar9->Feature);
              if (!_Var4) {
                local_510._M_current =
                     (int *)std::vector<int,_std::allocator<int>_>::cbegin
                                      ((vector<int,_std::allocator<int>_> *)
                                       &groupFeature_2->_M_string_length);
                local_518 = (int *)std::vector<int,_std::allocator<int>_>::cend
                                             ((vector<int,_std::allocator<int>_> *)
                                              &groupFeature_2->_M_string_length);
                local_508 = std::
                            find<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>
                                      (local_510,
                                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                        )local_518,(int *)&local_27c);
                local_520._M_current =
                     (int *)std::vector<int,_std::allocator<int>_>::cend
                                      ((vector<int,_std::allocator<int>_> *)
                                       &groupFeature_2->_M_string_length);
                bVar3 = __gnu_cxx::operator!=(&local_508,&local_520);
                if (bVar3) {
                  pcVar2 = this->CMakeInstance;
                  cmAlphaNum::cmAlphaNum(&local_570,"Impossible to link target \'");
                  psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
                  cmAlphaNum::cmAlphaNum((cmAlphaNum *)(local_5b8 + 0x18),psVar7);
                  local_5b8[0x17] = 0x27;
                  local_5b8[0x16] = 0x27;
                  cmStrCat<char[26],std::__cxx11::string,char[38],std::__cxx11::string,char,char[42],std::__cxx11::string,char,char[24]>
                            (&local_540,&local_570,(cmAlphaNum *)(local_5b8 + 0x18),
                             (char (*) [26])"\' because the link item \'",itemFeature,
                             (char (*) [38])"\', specified with the group feature \'",
                             &pvVar9->Feature,local_5b8 + 0x17,
                             (char (*) [42])", has already occurred with the feature \'",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_500,local_5b8 + 0x16,(char (*) [24])", which is not allowed.");
                  cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_5b8);
                  cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_540,(cmListFileBacktrace *)local_5b8
                                     );
                  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_5b8);
                  std::__cxx11::string::~string((string *)&local_540);
                }
              }
              std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
              ::operator++(&__end4);
            }
          }
          bVar3 = std::operator!=(itemFeature + 2,groupFeature_1);
          if (bVar3) {
            pcVar2 = this->CMakeInstance;
            cmAlphaNum::cmAlphaNum(&local_608,"Impossible to link target \'");
            psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
            cmAlphaNum::cmAlphaNum(&local_638,psVar7);
            psVar7 = itemFeature;
            _Var4 = std::operator==(groupFeature_1,&LinkEntry::DEFAULT_abi_cxx11_);
            local_65a = 0;
            if (_Var4) {
              std::allocator<char>::allocator();
              local_65a = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_658,"without any feature or \'DEFAULT\' feature",
                         &local_659);
            }
            else {
              cmAlphaNum::cmAlphaNum(&local_690,"with the feature \'");
              cmAlphaNum::cmAlphaNum(&local_6c0,groupFeature_1);
              local_6c1 = '\'';
              cmStrCat<char>(&local_658,&local_690,&local_6c0,&local_6c1);
            }
            _Var4 = std::operator==(itemFeature + 2,&LinkEntry::DEFAULT_abi_cxx11_);
            local_6ea = 0;
            if (_Var4) {
              std::allocator<char>::allocator();
              local_6ea = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_6e8,"without any feature or \'DEFAULT\' feature",
                         &local_6e9);
            }
            else {
              cmAlphaNum::cmAlphaNum(&local_720,"with the feature \'");
              cmAlphaNum::cmAlphaNum(&local_750,itemFeature + 2);
              local_751 = '\'';
              cmStrCat<char>(&local_6e8,&local_720,&local_750,&local_751);
            }
            cmStrCat<char[26],std::__cxx11::string,char[14],std::__cxx11::string,char[24],std::__cxx11::string,char[24]>
                      (&local_5d8,&local_608,&local_638,(char (*) [26])"\' because the link item \'"
                       ,psVar7,(char (*) [14])"\', specified ",&local_658,
                       (char (*) [24])", has already occurred ",&local_6e8,
                       (char (*) [24])", which is not allowed.");
            cmGeneratorTarget::GetBacktrace
                      ((cmGeneratorTarget *)
                       &indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_5d8,
                                (cmListFileBacktrace *)
                                &indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
            cmListFileBacktrace::~cmListFileBacktrace
                      ((cmListFileBacktrace *)
                       &indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::~string((string *)&local_5d8);
            std::__cxx11::string::~string((string *)&local_6e8);
            if ((local_6ea & 1) != 0) {
              std::allocator<char>::~allocator(&local_6e9);
            }
            std::__cxx11::string::~string((string *)&local_658);
            if ((local_65a & 1) != 0) {
              std::allocator<char>::~allocator(&local_659);
            }
          }
        }
        if ((groupIndex.first._3_1_ & 1) == 0) {
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)local_780);
          bVar3 = false;
          __end3 = std::
                   map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                   ::begin(&this->GroupItems);
          group = (pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)
                  std::
                  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::end(&this->GroupItems);
          while( true ) {
            bVar5 = std::operator!=(&__end3,(_Self *)&group);
            if (!bVar5) break;
            __x = std::
                  _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                  ::operator*(&__end3);
            __end4_1 = std::vector<int,_std::allocator<int>_>::begin(&__x->second);
            cStack_7c0 = std::vector<int,_std::allocator<int>_>::end(&__x->second);
            while( true ) {
              bVar5 = __gnu_cxx::operator!=(&__end4_1,&stack0xfffffffffffff840);
              if (!bVar5) break;
              piVar12 = __gnu_cxx::
                        __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                        operator*(&__end4_1);
              psVar7 = itemFeature;
              pvVar9 = std::
                       vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                       ::operator[](&this->EntryList,(long)*piVar12);
              _Var4 = std::operator==(psVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)pvVar9);
              if (_Var4) {
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)local_780,&__x->first);
                bVar3 = true;
                break;
              }
              __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&__end4_1);
            }
            std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
            operator++(&__end3);
          }
          if (!bVar3) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)local_780,
                       (value_type_conflict1 *)&local_27c);
          }
          __end3_1 = std::vector<int,_std::allocator<int>_>::begin
                               ((vector<int,_std::allocator<int>_> *)local_780);
          iStack_7e0 = std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)local_780);
          while( true ) {
            bVar3 = __gnu_cxx::operator!=(&__end3_1,&stack0xfffffffffffff820);
            if (!bVar3) break;
            piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                      operator*(&__end3_1);
            local_7e4 = *piVar13;
            if (depender_index < 0) {
              std::vector<int,_std::allocator<int>_>::push_back(&this->OriginalEntries,&local_7e4);
            }
            else {
              pvVar14 = (vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                        std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                                  (&(this->EntryConstraintGraph).
                                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                                   (long)depender_index);
              local_7e5 = false;
              local_7e6 = false;
              __range4_2 = (map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                            *)0x0;
              _Stack_7f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&__range4_2);
              std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
              emplace_back<int&,bool,bool,cmListFileBacktrace>
                        (pvVar14,&local_7e4,&local_7e5,&local_7e6,(cmListFileBacktrace *)&__range4_2
                        );
              cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&__range4_2);
            }
            pmVar1 = (map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                      *)((long)&feature.field_2 + 8);
            __end4_2 = std::
                       map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                       ::begin(pmVar1);
            dependSet = (pair<const_int,_cmComputeLinkDepends::DependSet> *)
                        std::
                        map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                        ::end(pmVar1);
            while( true ) {
              bVar3 = std::operator!=(&__end4_2,(_Self *)&dependSet);
              if (!bVar3) break;
              ppVar15 = std::
                        _Rb_tree_iterator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>::
                        operator*(&__end4_2);
              pvVar9 = std::
                       vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                       ::operator[](&this->EntryList,(long)local_7e4);
              if (pvVar9->Target == (cmGeneratorTarget *)0x0) {
                pvVar9 = std::
                         vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                         ::operator[](&this->EntryList,(long)local_7e4);
                if (pvVar9->Kind != Flag) {
                  pvVar9 = std::
                           vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                           ::operator[](&this->EntryList,(long)local_7e4);
                  if ((pvVar9->Kind != Group) && (local_27c != (float)ppVar15->first)) {
                    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                              (&(ppVar15->second).
                                super_set<int,_std::less<int>,_std::allocator<int>_>,&local_7e4);
                  }
                }
              }
              std::_Rb_tree_iterator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>::
              operator++(&__end4_2);
            }
            pvVar16 = std::
                      vector<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
                      ::operator[](&this->InferredDependSets,(long)local_7e4);
            if ((pvVar16->Initialized & 1U) != 0) {
              std::
              map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
              ::operator[]((map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                            *)((long)&feature.field_2 + 8),&local_7e4);
            }
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&__end3_1);
          }
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)local_780);
        }
        else {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&__range1,
                     (value_type_conflict1 *)&local_27c);
        }
      }
    }
LAB_0089535c:
    __gnu_cxx::
    __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
    ::operator++(&__end0);
  } while( true );
}

Assistant:

void cmComputeLinkDepends::AddLinkEntries(int depender_index,
                                          std::vector<T> const& libs)
{
  // Track inferred dependency sets implied by this list.
  std::map<int, DependSet> dependSets;
  std::string feature = LinkEntry::DEFAULT;

  bool inGroup = false;
  std::pair<int, bool> groupIndex{ -1, false };
  std::vector<int> groupItems;

  // Loop over the libraries linked directly by the depender.
  for (T const& l : libs) {
    // Skip entries that will resolve to the target getting linked or
    // are empty.
    cmLinkItem const& item = l;
    if (item.AsStr() == this->Target->GetName() || item.AsStr().empty()) {
      continue;
    }

    if (cmHasPrefix(item.AsStr(), LL_BEGIN) &&
        cmHasSuffix(item.AsStr(), '>')) {
      feature = ExtractFeature(item.AsStr());
      // emit a warning if an undefined feature is used as part of
      // an imported target
      if (depender_index >= 0) {
        const auto& depender = this->EntryList[depender_index];
        if (depender.Target != nullptr && depender.Target->IsImported() &&
            !IsFeatureSupported(this->Makefile, this->LinkLanguage, feature)) {
          this->CMakeInstance->IssueMessage(
            MessageType::AUTHOR_ERROR,
            cmStrCat("The 'IMPORTED' target '", depender.Target->GetName(),
                     "' uses the generator-expression '$<LINK_LIBRARY>' with "
                     "the feature '",
                     feature,
                     "', which is undefined or unsupported.\nDid you miss to "
                     "define it by setting variables \"CMAKE_",
                     this->LinkLanguage, "_LINK_LIBRARY_USING_", feature,
                     "\" and \"CMAKE_", this->LinkLanguage,
                     "_LINK_LIBRARY_USING_", feature, "_SUPPORTED\"?"),
            this->Target->GetBacktrace());
        }
      }
      continue;
    }
    if (cmHasPrefix(item.AsStr(), LL_END) && cmHasSuffix(item.AsStr(), '>')) {
      feature = LinkEntry::DEFAULT;
      continue;
    }

    if (cmHasPrefix(item.AsStr(), LG_BEGIN) &&
        cmHasSuffix(item.AsStr(), '>')) {
      groupIndex = this->AddLinkEntry(item);
      if (groupIndex.second) {
        LinkEntry& entry = this->EntryList[groupIndex.first];
        entry.Feature = ExtractGroupFeature(item.AsStr());
      }
      inGroup = true;
      if (depender_index >= 0) {
        this->EntryConstraintGraph[depender_index].emplace_back(
          groupIndex.first, false, false, cmListFileBacktrace());
      } else {
        // This is a direct dependency of the target being linked.
        this->OriginalEntries.push_back(groupIndex.first);
      }
      continue;
    }

    int dependee_index;

    if (cmHasPrefix(item.AsStr(), LG_END) && cmHasSuffix(item.AsStr(), '>')) {
      dependee_index = groupIndex.first;
      if (groupIndex.second) {
        this->GroupItems.emplace(groupIndex.first, groupItems);
      }
      inGroup = false;
      groupIndex = std::make_pair(-1, false);
      groupItems.clear();
      continue;
    }

    if (depender_index >= 0 && inGroup) {
      const auto& depender = this->EntryList[depender_index];
      const auto& groupFeature = this->EntryList[groupIndex.first].Feature;
      if (depender.Target != nullptr && depender.Target->IsImported() &&
          !IsGroupFeatureSupported(this->Makefile, this->LinkLanguage,
                                   groupFeature)) {
        this->CMakeInstance->IssueMessage(
          MessageType::AUTHOR_ERROR,
          cmStrCat("The 'IMPORTED' target '", depender.Target->GetName(),
                   "' uses the generator-expression '$<LINK_GROUP>' with "
                   "the feature '",
                   groupFeature,
                   "', which is undefined or unsupported.\nDid you miss to "
                   "define it by setting variables \"CMAKE_",
                   this->LinkLanguage, "_LINK_GROUP_USING_", groupFeature,
                   "\" and \"CMAKE_", this->LinkLanguage, "_LINK_GROUP_USING_",
                   groupFeature, "_SUPPORTED\"?"),
          this->Target->GetBacktrace());
      }
    }

    // Add a link entry for this item.
    auto ale = this->AddLinkEntry(item, groupIndex.first);
    dependee_index = ale.first;
    LinkEntry& entry = this->EntryList[dependee_index];
    auto const& itemFeature =
      this->GetCurrentFeature(entry.Item.Value, feature);
    if (inGroup && ale.second && entry.Target != nullptr &&
        (entry.Target->GetType() == cmStateEnums::TargetType::OBJECT_LIBRARY ||
         entry.Target->GetType() ==
           cmStateEnums::TargetType::INTERFACE_LIBRARY)) {
      const auto& groupFeature = this->EntryList[groupIndex.first].Feature;
      this->CMakeInstance->IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(
          "The feature '", groupFeature,
          "', specified as part of a generator-expression "
          "'$",
          LG_BEGIN, groupFeature, ">', will not be applied to the ",
          (entry.Target->GetType() == cmStateEnums::TargetType::OBJECT_LIBRARY
             ? "OBJECT"
             : "INTERFACE"),
          " library '", entry.Item.Value, "'."),
        this->Target->GetBacktrace());
    }
    if (itemFeature != LinkEntry::DEFAULT) {
      if (ale.second) {
        // current item not yet defined
        if (entry.Target != nullptr &&
            (entry.Target->GetType() ==
               cmStateEnums::TargetType::OBJECT_LIBRARY ||
             entry.Target->GetType() ==
               cmStateEnums::TargetType::INTERFACE_LIBRARY)) {
          this->CMakeInstance->IssueMessage(
            MessageType::AUTHOR_WARNING,
            cmStrCat("The feature '", feature,
                     "', specified as part of a generator-expression "
                     "'$",
                     LL_BEGIN, feature, ">', will not be applied to the ",
                     (entry.Target->GetType() ==
                          cmStateEnums::TargetType::OBJECT_LIBRARY
                        ? "OBJECT"
                        : "INTERFACE"),
                     " library '", entry.Item.Value, "'."),
            this->Target->GetBacktrace());
        } else {
          entry.Feature = itemFeature;
        }
      }
    }

    bool supportedItem = entry.Target == nullptr ||
      (entry.Target->GetType() != cmStateEnums::TargetType::OBJECT_LIBRARY &&
       entry.Target->GetType() != cmStateEnums::TargetType::INTERFACE_LIBRARY);

    if (supportedItem) {
      if (inGroup) {
        const auto& currentFeature = this->EntryList[groupIndex.first].Feature;
        for (const auto& g : this->GroupItems) {
          const auto& groupFeature = this->EntryList[g.first].Feature;
          if (groupFeature == currentFeature) {
            continue;
          }
          if (std::find(g.second.cbegin(), g.second.cend(), dependee_index) !=
              g.second.cend()) {
            this->CMakeInstance->IssueMessage(
              MessageType::FATAL_ERROR,
              cmStrCat("Impossible to link target '", this->Target->GetName(),
                       "' because the link item '", entry.Item.Value,
                       "', specified with the group feature '", currentFeature,
                       '\'', ", has already occurred with the feature '",
                       groupFeature, '\'', ", which is not allowed."),
              this->Target->GetBacktrace());
            continue;
          }
        }
      }
      if (entry.Feature != itemFeature) {
        // incompatibles features occurred
        this->CMakeInstance->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("Impossible to link target '", this->Target->GetName(),
                   "' because the link item '", entry.Item.Value,
                   "', specified ",
                   (itemFeature == LinkEntry::DEFAULT
                      ? "without any feature or 'DEFAULT' feature"
                      : cmStrCat("with the feature '", itemFeature, '\'')),
                   ", has already occurred ",
                   (entry.Feature == LinkEntry::DEFAULT
                      ? "without any feature or 'DEFAULT' feature"
                      : cmStrCat("with the feature '", entry.Feature, '\'')),
                   ", which is not allowed."),
          this->Target->GetBacktrace());
      }
    }

    if (inGroup) {
      // store item index for dependencies handling
      groupItems.push_back(dependee_index);
    } else {
      std::vector<int> indexes;
      bool entryHandled = false;
      // search any occurrence of the library in already defined groups
      for (const auto& group : this->GroupItems) {
        for (auto index : group.second) {
          if (entry.Item.Value == this->EntryList[index].Item.Value) {
            indexes.push_back(group.first);
            entryHandled = true;
            break;
          }
        }
      }
      if (!entryHandled) {
        indexes.push_back(dependee_index);
      }

      for (auto index : indexes) {
        // The dependee must come after the depender.
        if (depender_index >= 0) {
          this->EntryConstraintGraph[depender_index].emplace_back(
            index, false, false, cmListFileBacktrace());
        } else {
          // This is a direct dependency of the target being linked.
          this->OriginalEntries.push_back(index);
        }

        // Update the inferred dependencies for earlier items.
        for (auto& dependSet : dependSets) {
          // Add this item to the inferred dependencies of other items.
          // Target items are never inferred dependees because unknown
          // items are outside libraries that should not be depending on
          // targets.
          if (!this->EntryList[index].Target &&
              this->EntryList[index].Kind != LinkEntry::Flag &&
              this->EntryList[index].Kind != LinkEntry::Group &&
              dependee_index != dependSet.first) {
            dependSet.second.insert(index);
          }
        }

        // If this item needs to have dependencies inferred, do so.
        if (this->InferredDependSets[index].Initialized) {
          // Make sure an entry exists to hold the set for the item.
          dependSets[index];
        }
      }
    }
  }

  // Store the inferred dependency sets discovered for this list.
  for (auto const& dependSet : dependSets) {
    this->InferredDependSets[dependSet.first].push_back(dependSet.second);
  }
}